

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O3

void blot_bullet(Am_Object *bullet)

{
  ulong uVar1;
  ushort uVar2;
  Am_Object AStack_18;
  Am_Object local_10;
  
  uVar2 = (ushort)bullet;
  Am_Object::Set(uVar2,true,0);
  uVar1 = Am_Object::Get(uVar2,0x65);
  Am_Object::Set(uVar2,(Am_Value *)0x65,uVar1);
  Am_Object::Get_Object((ushort)&local_10,(ulong)bullet);
  Am_Object::Am_Object(&AStack_18,bullet);
  Am_Object::Remove_Part((Am_Object_Data *)&local_10);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::~Am_Object(&local_10);
  num_bullets = num_bullets + -1;
  return;
}

Assistant:

void
blot_bullet(Am_Object bullet)
{
  bullet.Set(Am_VISIBLE, false);
  bullet.Set(Am_TOP, bullet.Get(Am_TOP));
  bullet.Get_Owner().Remove_Part(bullet);
// we'd rather destroy it...
#if 0
  bullet.Destroy();
#endif
  // but there seems to be a bug with that

  num_bullets--;
}